

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HVectorBase.cpp
# Opt level: O3

void __thiscall HVectorBase<double>::tight(HVectorBase<double> *this)

{
  int iVar1;
  pointer piVar2;
  pointer pdVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  HighsInt HVar7;
  
  iVar4 = this->count;
  if (iVar4 < 0) {
    pdVar3 = (this->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar6 = (long)(this->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pdVar3;
    if (lVar6 != 0) {
      lVar6 = lVar6 >> 3;
      lVar5 = 0;
      do {
        if (ABS(pdVar3[lVar5]) < 1e-14) {
          pdVar3[lVar5] = 0.0;
        }
        lVar5 = lVar5 + 1;
      } while (lVar6 + (ulong)(lVar6 == 0) != lVar5);
    }
    return;
  }
  if (iVar4 == 0) {
    HVar7 = 0;
  }
  else {
    piVar2 = (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar6 = 0;
    HVar7 = 0;
    do {
      iVar1 = piVar2[lVar6];
      if (1e-14 <= ABS(pdVar3[iVar1])) {
        lVar5 = (long)HVar7;
        HVar7 = HVar7 + 1;
        piVar2[lVar5] = iVar1;
        iVar4 = this->count;
      }
      else {
        pdVar3[iVar1] = 0.0;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar4);
  }
  this->count = HVar7;
  return;
}

Assistant:

void HVectorBase<Real>::tight() {
  /*
   * Zero values in Vector.array that do not exceed kHighsTiny in
   * magnitude, maintaining index if it is well defined
   */
  HighsInt totalCount = 0;
  using std::abs;
  if (count < 0) {
    for (size_t my_index = 0; my_index < array.size(); my_index++)
      if (abs(array[my_index]) < kHighsTiny) array[my_index] = 0;
  } else {
    for (HighsInt i = 0; i < count; i++) {
      const HighsInt my_index = index[i];
      const Real& value = array[my_index];
      if (abs(value) >= kHighsTiny) {
        index[totalCount++] = my_index;
      } else {
        array[my_index] = Real{0};
      }
    }
    count = totalCount;
  }
}